

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_json_regex(void)

{
  byte bVar1;
  int iVar2;
  undefined1 local_20 [8];
  size_t len;
  char *str;
  bson_t *b;
  
  str = (char *)bson_new();
  bVar1 = bson_append_regex(str,"regex",0xffffffff,"^abcd","xi");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x215,"test_bson_as_json_regex",
            "bson_append_regex (b, \"regex\", -1, \"^abcd\", \"xi\")");
    abort();
  }
  bVar1 = bson_append_regex(str,"escaping",0xffffffff,"^\"","");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x216,"test_bson_as_json_regex",
            "bson_append_regex (b, \"escaping\", -1, \"^\\\"\", \"\")");
    abort();
  }
  bVar1 = bson_append_regex(str,"ordered",0xffffffff,"^abcd","ilmsux");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x217,"test_bson_as_json_regex",
            "bson_append_regex (b, \"ordered\", -1, \"^abcd\", \"ilmsux\")");
    abort();
  }
  bVar1 = bson_append_regex(str,"unordered",0xffffffff,"^abcd","xusmli");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x218,"test_bson_as_json_regex",
            "bson_append_regex (b, \"unordered\", -1, \"^abcd\", \"xusmli\")");
    abort();
  }
  bVar1 = bson_append_regex(str,"duplicate",0xffffffff,"^abcd","mmiii");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x219,"test_bson_as_json_regex",
            "bson_append_regex (b, \"duplicate\", -1, \"^abcd\", \"mmiii\")");
    abort();
  }
  bVar1 = bson_append_regex(str,"unsupported",0xffffffff,"^abcd","jkmlvz");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x21a,"test_bson_as_json_regex",
            "bson_append_regex (b, \"unsupported\", -1, \"^abcd\", \"jkmlvz\")");
    abort();
  }
  len = bson_as_json(str,local_20);
  if ((char *)len !=
      "{ \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ix\" }, \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" : \"\" }, \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" : \"im\" }, \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" : \"lm\" } }"
     ) {
    iVar2 = strcmp((char *)len,
                   "{ \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ix\" }, \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" : \"\" }, \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" : \"im\" }, \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" : \"lm\" } }"
                  );
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",len,
              "{ \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ix\" }, \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" : \"\" }, \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" : \"ilmsux\" }, \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" : \"im\" }, \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" : \"lm\" } }"
             );
      abort();
    }
  }
  bson_free(len);
  bson_destroy(str);
  return;
}

Assistant:

static void
test_bson_as_json_regex (void)
{
   bson_t *b;
   char *str;
   size_t len;

   b = bson_new ();
   BSON_ASSERT (bson_append_regex (b, "regex", -1, "^abcd", "xi"));
   BSON_ASSERT (bson_append_regex (b, "escaping", -1, "^\"", ""));
   BSON_ASSERT (bson_append_regex (b, "ordered", -1, "^abcd", "ilmsux"));
   BSON_ASSERT (bson_append_regex (b, "unordered", -1, "^abcd", "xusmli"));
   BSON_ASSERT (bson_append_regex (b, "duplicate", -1, "^abcd", "mmiii"));
   BSON_ASSERT (bson_append_regex (b, "unsupported", -1, "^abcd", "jkmlvz"));
   str = bson_as_json (b, &len);

   ASSERT_CMPSTR (str,
                  "{"
                  " \"regex\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"ix\" },"
                  " \"escaping\" : { \"$regex\" : \"^\\\"\", \"$options\" "
                  ": \"\" },"
                  " \"ordered\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"ilmsux\" },"
                  " \"unordered\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"ilmsux\" },"
                  " \"duplicate\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"im\" },"
                  " \"unsupported\" : { \"$regex\" : \"^abcd\", \"$options\" "
                  ": \"lm\" } }");

   bson_free (str);
   bson_destroy (b);
}